

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bestfit.cpp
# Opt level: O3

bool getBestFitPlane(uint vcount,float *points,uint vstride,float *weights,uint wstride,float *plane
                    )

{
  float fVar1;
  float *pfVar2;
  uint uVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float local_7c;
  float local_78;
  undefined1 local_68 [16];
  undefined1 local_50 [20];
  float fStack_3c;
  float local_30;
  
  if (vcount == 0) {
    fVar6 = INFINITY;
    auVar9 = ZEXT1664(ZEXT816(0) << 0x40);
    local_68 = SUB6416(ZEXT464(0x7fc00000),0);
    local_78 = NAN;
    local_7c = NAN;
    auVar8 = ZEXT1264(ZEXT812(0));
  }
  else {
    pfVar2 = points + 2;
    auVar7 = ZEXT816(0) << 0x40;
    fVar6 = 0.0;
    auVar10 = ZEXT816(0) << 0x40;
    pfVar4 = weights;
    uVar3 = vcount;
    do {
      if (pfVar4 == (float *)0x0) {
        auVar5 = SUB6416(ZEXT464(0x3f800000),0);
        pfVar4 = (float *)0x0;
      }
      else {
        auVar5 = ZEXT416((uint)*pfVar4);
        pfVar4 = (float *)((long)pfVar4 + (ulong)wstride);
      }
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)(pfVar2 + -2);
      auVar10 = vfmadd231ss_fma(auVar10,auVar5,ZEXT416((uint)*pfVar2));
      fVar11 = auVar5._0_4_;
      auVar5._4_4_ = fVar11;
      auVar5._0_4_ = fVar11;
      auVar5._8_4_ = fVar11;
      auVar5._12_4_ = fVar11;
      fVar6 = fVar6 + fVar11;
      pfVar2 = (float *)((long)pfVar2 + (ulong)vstride);
      uVar3 = uVar3 - 1;
      auVar7 = vfmadd231ps_fma(auVar7,auVar12,auVar5);
    } while (uVar3 != 0);
    pfVar2 = points + 2;
    fVar6 = 1.0 / fVar6;
    local_7c = auVar10._0_4_ * fVar6;
    auVar10 = ZEXT816(0) << 0x20;
    local_68._0_4_ = auVar7._0_4_ * fVar6;
    local_68._4_4_ = auVar7._4_4_ * fVar6;
    local_68._8_4_ = auVar7._8_4_ * fVar6;
    local_68._12_4_ = auVar7._12_4_ * fVar6;
    auVar8 = ZEXT864(0) << 0x20;
    auVar7 = vmovshdup_avx(local_68);
    local_78 = auVar7._0_4_;
    do {
      if (weights == (float *)0x0) {
        weights = (float *)0x0;
        fVar11 = 1.0;
      }
      else {
        fVar11 = *weights;
        weights = (float *)((long)weights + (ulong)wstride);
      }
      fVar1 = *pfVar2;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)(pfVar2 + -2);
      pfVar2 = (float *)((long)pfVar2 + (ulong)vstride);
      vcount = vcount - 1;
      auVar7 = vsubps_avx(auVar14,local_68);
      fVar1 = fVar11 * (fVar1 - local_7c);
      auVar13._0_8_ = CONCAT44(fVar11 * auVar7._4_4_,fVar11 * auVar7._0_4_);
      auVar13._8_4_ = fVar11 * auVar7._8_4_;
      auVar13._12_4_ = fVar11 * auVar7._12_4_;
      auVar7._4_4_ = fVar1;
      auVar7._0_4_ = fVar1;
      auVar7._8_4_ = fVar1;
      auVar7._12_4_ = fVar1;
      auVar16._4_12_ = auVar13._4_12_;
      auVar16._0_4_ = fVar1;
      auVar15._8_8_ = auVar13._0_8_;
      auVar15._0_8_ = auVar13._0_8_;
      auVar5 = vpermt2ps_avx512vl(auVar13,_DAT_009f10a0,auVar7);
      auVar7 = vfmadd231ps_fma(auVar8._0_16_,auVar7,auVar16);
      auVar8 = ZEXT1664(auVar7);
      auVar10 = vfmadd231ps_fma(auVar10,auVar15,auVar5);
    } while (vcount != 0);
    auVar5 = vpermi2ps_avx512vl(_DAT_009f10b0,auVar10,auVar7);
    auVar7 = vshufps_avx(auVar10,auVar10,100);
    auVar9 = ZEXT3264(CONCAT1616(auVar5,auVar7));
  }
  local_30 = fVar6 * auVar8._0_4_;
  auVar8._0_4_ = fVar6 * auVar9._0_4_;
  auVar8._4_4_ = fVar6 * auVar9._4_4_;
  auVar8._8_4_ = fVar6 * auVar9._8_4_;
  auVar8._12_4_ = fVar6 * auVar9._12_4_;
  auVar8._16_4_ = fVar6 * auVar9._16_4_;
  auVar8._20_4_ = fVar6 * auVar9._20_4_;
  auVar8._28_36_ = auVar9._28_36_;
  auVar8._24_4_ = fVar6 * auVar9._24_4_;
  _local_50 = auVar8._0_32_;
  BestFit::Eigen::DecrSortEigenStuff((Eigen *)local_50);
  *plane = (float)local_50._8_4_;
  plane[1] = fStack_3c;
  plane[2] = local_30;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fStack_3c * local_78)),ZEXT416((uint)local_50._8_4_),
                           ZEXT416((uint)local_68._0_4_));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_30),ZEXT416((uint)local_7c));
  plane[3] = 0.0 - auVar7._0_4_;
  return false;
}

Assistant:

bool getBestFitPlane(unsigned int vcount,
                     const float *points,
                     unsigned int vstride,
                     const float *weights,
                     unsigned int wstride,
                     float *plane)
{
  bool ret = false;

  Vec3 kOrigin(0,0,0);

  float wtotal = 0;

  if ( 1 )
  {
    const char *source  = (const char *) points;
    const char *wsource = (const char *) weights;

    for (unsigned int i=0; i<vcount; i++)
    {

      const float *p = (const float *) source;

      float w = 1;

      if ( wsource )
      {
        const float *ws = (const float *) wsource;
        w = *ws; //
        wsource+=wstride;
      }

      kOrigin.x+=p[0]*w;
      kOrigin.y+=p[1]*w;
      kOrigin.z+=p[2]*w;

      wtotal+=w;

      source+=vstride;
    }
  }

  float recip = 1.0f / wtotal; // reciprocol of total weighting

  kOrigin.x*=recip;
  kOrigin.y*=recip;
  kOrigin.z*=recip;


  float fSumXX=0;
  float fSumXY=0;
  float fSumXZ=0;

  float fSumYY=0;
  float fSumYZ=0;
  float fSumZZ=0;


  if ( 1 )
  {
    const char *source  = (const char *) points;
    const char *wsource = (const char *) weights;

    for (unsigned int i=0; i<vcount; i++)
    {

      const float *p = (const float *) source;

      float w = 1;

      if ( wsource )
      {
        const float *ws = (const float *) wsource;
        w = *ws; //
        wsource+=wstride;
      }

      Vec3 kDiff;

      kDiff.x = w*(p[0] - kOrigin.x); // apply vertex weighting!
      kDiff.y = w*(p[1] - kOrigin.y);
      kDiff.z = w*(p[2] - kOrigin.z);

      fSumXX+= kDiff.x * kDiff.x; // sume of the squares of the differences.
      fSumXY+= kDiff.x * kDiff.y; // sume of the squares of the differences.
      fSumXZ+= kDiff.x * kDiff.z; // sume of the squares of the differences.

      fSumYY+= kDiff.y * kDiff.y;
      fSumYZ+= kDiff.y * kDiff.z;
      fSumZZ+= kDiff.z * kDiff.z;


      source+=vstride;
    }
  }

  fSumXX *= recip;
  fSumXY *= recip;
  fSumXZ *= recip;
  fSumYY *= recip;
  fSumYZ *= recip;
  fSumZZ *= recip;

  // setup the eigensolver
  Eigen kES;

  kES.mElement[0][0] = fSumXX;
  kES.mElement[0][1] = fSumXY;
  kES.mElement[0][2] = fSumXZ;

  kES.mElement[1][0] = fSumXY;
  kES.mElement[1][1] = fSumYY;
  kES.mElement[1][2] = fSumYZ;

  kES.mElement[2][0] = fSumXZ;
  kES.mElement[2][1] = fSumYZ;
  kES.mElement[2][2] = fSumZZ;

  // compute eigenstuff, smallest eigenvalue is in last position
  kES.DecrSortEigenStuff();

  Vec3 kNormal;

  kNormal.x = kES.mElement[0][2];
  kNormal.y = kES.mElement[1][2];
  kNormal.z = kES.mElement[2][2];

  // the minimum energy
  plane[0] = kNormal.x;
  plane[1] = kNormal.y;
  plane[2] = kNormal.z;

  plane[3] = 0 - kNormal.dot(kOrigin);

  return ret;
}